

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O2

reference __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
join_function::evaluate
          (join_function *this,
          vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          *args,eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *context,error_code *ec)

{
  pointer ppVar1;
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *this_00;
  bool bVar2;
  bool bVar3;
  iterator this_01;
  reference pbVar4;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar5;
  assertion_error *this_02;
  const_array_range_type cVar6;
  basic_string_view<char,_std::char_traits<char>_> bVar7;
  string_type sep;
  string_type buf;
  
  ppVar1 = (args->
           super__Vector_base<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 4 !=
      (this->
      super_function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
      ).arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value) {
    this_02 = (assertion_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sep,"assertion \'args.size() == *this->arity()\' failed at  <> :0",
               (allocator<char> *)&buf);
    assertion_error::assertion_error(this_02,&sep);
    __cxa_throw(this_02,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((ppVar1->type_ == value) && (ppVar1[1].type_ == value)) {
    this_00 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)
              (ppVar1->field_1).value_;
    pbVar5 = ppVar1[1].field_1.value_;
    bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this_00);
    if (bVar2) {
      bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array(pbVar5);
      if (bVar2) {
        basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
        as_string<std::allocator<char>>(&sep,this_00);
        buf._M_dataplus._M_p = (pointer)&buf.field_2;
        buf._M_string_length = 0;
        buf.field_2._M_local_buf[0] = '\0';
        cVar6 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range
                          (pbVar5);
        this_01 = cVar6.first_._M_current;
        bVar2 = true;
        do {
          if (this_01._M_current == cVar6.last_._M_current._M_current) {
            pbVar5 = eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                     ::create_json<std::__cxx11::string&>
                               ((eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                                 *)context,&buf);
LAB_002c95f5:
            std::__cxx11::string::~string((string *)&buf);
            std::__cxx11::string::~string((string *)&sep);
            return pbVar5;
          }
          bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string
                            (this_01._M_current);
          if (!bVar3) {
            std::error_code::operator=(ec,invalid_type);
            pbVar5 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                     ::null_value(context);
            goto LAB_002c95f5;
          }
          if (!bVar2) {
            std::__cxx11::string::append((string *)&buf);
          }
          bVar7 = json_type_traits<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_void>
                  ::as(this_01._M_current);
          std::__cxx11::string::append<char_const*,void>
                    ((string *)&buf,bVar7._M_str,bVar7._M_str + bVar7._M_len);
          this_01._M_current = this_01._M_current + 1;
          bVar2 = false;
        } while( true );
      }
    }
  }
  std::error_code::operator=(ec,invalid_type);
  pbVar4 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           ::null_value(context);
  return pbVar4;
}

Assistant:

reference evaluate(const std::vector<parameter_type>& args, eval_context<Json>& context, std::error_code& ec) const override
            {
                JSONCONS_ASSERT(args.size() == *this->arity());

                reference arg0 = args[0].value();
                reference arg1 = args[1].value();

                if (!(args[0].is_value() && args[1].is_value()))
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }

                if (!arg0.is_string())
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }
                if (!arg1.is_array())
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }

                string_type sep = arg0.template as<string_type>();
                string_type buf;
                bool is_first = true;
                for (auto &j : arg1.array_range())
                {
                    if (!j.is_string())
                    {
                        ec = jmespath_errc::invalid_type;
                        return context.null_value();
                    }

                    if (is_first)
                    {
                        is_first = false;
                    }
                    else
                    {
                        buf.append(sep);
                    }
                    
                    auto sv = j.template as<string_view_type>();
                    buf.append(sv.begin(), sv.end());
                }
                return *context.create_json(buf);
            }